

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersector1<8,_1,_false,_embree::avx512::ArrayIntersector1<embree::avx512::QuadMvIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  RTCIntersectArguments *pRVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  float fVar6;
  float fVar7;
  float fVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  byte bVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  byte bVar20;
  long lVar21;
  long lVar22;
  byte bVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  float fVar51;
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [64];
  undefined4 uVar55;
  float fVar56;
  float fVar58;
  float fVar59;
  float fVar60;
  undefined1 auVar57 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [64];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  uint uVar70;
  uint uVar71;
  uint uVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  MoellerTrumboreHitM<8,_embree::avx512::UVIdentity<8>_> hit;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  uint local_2724;
  int local_270c;
  ulong local_2708;
  ulong local_2700;
  ulong *local_26f8;
  RayQueryContext *local_26f0;
  RayHit *local_26e8;
  long local_26e0;
  long local_26d8;
  Geometry *local_26d0;
  Scene *local_26c8;
  RTCFilterFunctionNArguments local_26c0;
  float local_2690;
  undefined4 local_268c;
  undefined4 local_2688;
  undefined4 local_2684;
  undefined4 local_2680;
  undefined4 local_267c;
  uint local_2678;
  uint local_2674;
  uint local_2670;
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined8 local_2540;
  undefined8 uStack_2538;
  undefined8 uStack_2530;
  undefined8 uStack_2528;
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  byte local_249f;
  float local_2480 [4];
  float fStack_2470;
  float fStack_246c;
  float fStack_2468;
  undefined4 uStack_2464;
  float local_2460 [4];
  float fStack_2450;
  float fStack_244c;
  float fStack_2448;
  undefined4 uStack_2444;
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  ulong local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  
  local_23a0 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    local_26f8 = local_2390;
    local_2398[0] = 0;
    aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar33 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar5 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar30._8_4_ = 0x7fffffff;
    auVar30._0_8_ = 0x7fffffff7fffffff;
    auVar30._12_4_ = 0x7fffffff;
    auVar30 = vandps_avx512vl((undefined1  [16])aVar2,auVar30);
    auVar63._8_4_ = 0x219392ef;
    auVar63._0_8_ = 0x219392ef219392ef;
    auVar63._12_4_ = 0x219392ef;
    uVar26 = vcmpps_avx512vl(auVar30,auVar63,1);
    bVar4 = (bool)((byte)uVar26 & 1);
    auVar31._0_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * (int)aVar2.x;
    bVar4 = (bool)((byte)(uVar26 >> 1) & 1);
    auVar31._4_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * (int)aVar2.y;
    bVar4 = (bool)((byte)(uVar26 >> 2) & 1);
    auVar31._8_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * (int)aVar2.z;
    bVar4 = (bool)((byte)(uVar26 >> 3) & 1);
    auVar31._12_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * aVar2.field_3.a;
    auVar30 = vrcp14ps_avx512vl(auVar31);
    auVar32._8_4_ = 0x3f800000;
    auVar32._0_8_ = 0x3f8000003f800000;
    auVar32._12_4_ = 0x3f800000;
    auVar32 = vfnmadd213ps_avx512vl(auVar31,auVar30,auVar32);
    auVar31 = vfmadd132ps_fma(auVar32,auVar30,auVar30);
    auVar34 = vbroadcastss_avx512vl(auVar31);
    auVar78 = ZEXT3264(auVar34);
    auVar30 = vmovshdup_avx(auVar31);
    auVar34 = vbroadcastsd_avx512vl(auVar30);
    auVar79 = ZEXT3264(auVar34);
    auVar32 = vshufpd_avx(auVar31,auVar31,1);
    auVar38._8_4_ = 2;
    auVar38._0_8_ = 0x200000002;
    auVar38._12_4_ = 2;
    auVar38._16_4_ = 2;
    auVar38._20_4_ = 2;
    auVar38._24_4_ = 2;
    auVar38._28_4_ = 2;
    auVar34 = vpermps_avx512vl(auVar38,ZEXT1632(auVar31));
    auVar80 = ZEXT3264(auVar34);
    fVar51 = auVar31._0_4_ * (ray->super_RayK<1>).org.field_0.m128[0];
    auVar41._4_4_ = fVar51;
    auVar41._0_4_ = fVar51;
    auVar41._8_4_ = fVar51;
    auVar41._12_4_ = fVar51;
    auVar41._16_4_ = fVar51;
    auVar41._20_4_ = fVar51;
    auVar41._24_4_ = fVar51;
    auVar41._28_4_ = fVar51;
    auVar34 = vbroadcastss_avx512vl(ZEXT416(1));
    auVar81 = ZEXT3264(auVar34);
    auVar36 = ZEXT1632(CONCAT412(auVar31._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3],
                                 CONCAT48(auVar31._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2],
                                          CONCAT44(auVar31._4_4_ *
                                                   (ray->super_RayK<1>).org.field_0.m128[1],fVar51))
                                ));
    auVar35 = vpermps_avx512vl(auVar34,auVar36);
    auVar34 = vpermps_avx2(auVar38,auVar36);
    local_2700 = (ulong)(auVar31._0_4_ < 0.0) << 5;
    local_2708 = (ulong)(auVar30._0_4_ < 0.0) << 5 | 0x40;
    uVar26 = (ulong)(auVar32._0_4_ < 0.0) << 5 | 0x80;
    uVar27 = local_2700 ^ 0x20;
    uVar29 = local_2708 ^ 0x20;
    uVar55 = auVar5._0_4_;
    auVar54 = ZEXT3264(CONCAT428(uVar55,CONCAT424(uVar55,CONCAT420(uVar55,CONCAT416(uVar55,CONCAT412
                                                  (uVar55,CONCAT48(uVar55,CONCAT44(uVar55,uVar55))))
                                                  ))));
    auVar37._8_4_ = 0x80000000;
    auVar37._0_8_ = 0x8000000080000000;
    auVar37._12_4_ = 0x80000000;
    auVar37._16_4_ = 0x80000000;
    auVar37._20_4_ = 0x80000000;
    auVar37._24_4_ = 0x80000000;
    auVar37._28_4_ = 0x80000000;
    auVar36 = vxorps_avx512vl(auVar41,auVar37);
    auVar82 = ZEXT3264(auVar36);
    auVar35 = vxorps_avx512vl(auVar35,auVar37);
    auVar83 = ZEXT3264(auVar35);
    auVar34 = vxorps_avx512vl(auVar34,auVar37);
    auVar84 = ZEXT3264(auVar34);
    auVar34 = vbroadcastss_avx512vl(auVar33);
    auVar85 = ZEXT3264(auVar34);
    auVar34 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
    auVar86 = ZEXT3264(auVar34);
    auVar34 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
    auVar87 = ZEXT3264(auVar34);
    auVar33 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
    auVar88 = ZEXT1664(auVar33);
    auVar34 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
    auVar89 = ZEXT3264(auVar34);
    local_26f0 = context;
    local_26e8 = ray;
    do {
      pfVar1 = (float *)(local_26f8 + -1);
      local_26f8 = local_26f8 + -2;
      if (*pfVar1 <= (local_26e8->super_RayK<1>).tfar) {
        uVar28 = *local_26f8;
        while ((uVar28 & 8) == 0) {
          auVar34 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar28 + 0x40 + local_2700),auVar82._0_32_,
                               auVar78._0_32_);
          auVar35 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar28 + 0x40 + local_2708),auVar83._0_32_,
                               auVar79._0_32_);
          auVar34 = vpmaxsd_avx2(auVar34,auVar35);
          auVar35 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar28 + 0x40 + uVar26),auVar84._0_32_,
                               auVar80._0_32_);
          auVar35 = vpmaxsd_avx512vl(auVar35,auVar85._0_32_);
          auVar34 = vpmaxsd_avx2(auVar34,auVar35);
          auVar35 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar28 + 0x40 + uVar27),auVar82._0_32_,
                               auVar78._0_32_);
          auVar36 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar28 + 0x40 + uVar29),auVar83._0_32_,
                               auVar79._0_32_);
          auVar35 = vpminsd_avx2(auVar35,auVar36);
          auVar36 = vfmadd132ps_avx512vl
                              (*(undefined1 (*) [32])(uVar28 + 0x40 + (uVar26 ^ 0x20)),
                               auVar84._0_32_,auVar80._0_32_);
          auVar36 = vpminsd_avx2(auVar36,auVar54._0_32_);
          auVar35 = vpminsd_avx2(auVar35,auVar36);
          uVar25 = vpcmpd_avx512vl(auVar34,auVar35,2);
          bVar20 = (byte)uVar25;
          if (bVar20 == 0) goto LAB_01f23fea;
          auVar35 = *(undefined1 (*) [32])(uVar28 & 0xfffffffffffffff0);
          auVar36 = ((undefined1 (*) [32])(uVar28 & 0xfffffffffffffff0))[1];
          auVar37 = vmovdqa64_avx512vl(auVar86._0_32_);
          auVar37 = vpternlogd_avx512vl(auVar37,auVar34,auVar87._0_32_,0xf8);
          auVar38 = vpcompressd_avx512vl(auVar37);
          auVar40._0_4_ =
               (uint)(bVar20 & 1) * auVar38._0_4_ | (uint)!(bool)(bVar20 & 1) * auVar37._0_4_;
          bVar4 = (bool)((byte)(uVar25 >> 1) & 1);
          auVar40._4_4_ = (uint)bVar4 * auVar38._4_4_ | (uint)!bVar4 * auVar37._4_4_;
          bVar4 = (bool)((byte)(uVar25 >> 2) & 1);
          auVar40._8_4_ = (uint)bVar4 * auVar38._8_4_ | (uint)!bVar4 * auVar37._8_4_;
          bVar4 = (bool)((byte)(uVar25 >> 3) & 1);
          auVar40._12_4_ = (uint)bVar4 * auVar38._12_4_ | (uint)!bVar4 * auVar37._12_4_;
          bVar4 = (bool)((byte)(uVar25 >> 4) & 1);
          auVar40._16_4_ = (uint)bVar4 * auVar38._16_4_ | (uint)!bVar4 * auVar37._16_4_;
          bVar4 = (bool)((byte)(uVar25 >> 5) & 1);
          auVar40._20_4_ = (uint)bVar4 * auVar38._20_4_ | (uint)!bVar4 * auVar37._20_4_;
          bVar4 = (bool)((byte)(uVar25 >> 6) & 1);
          auVar40._24_4_ = (uint)bVar4 * auVar38._24_4_ | (uint)!bVar4 * auVar37._24_4_;
          bVar4 = SUB81(uVar25 >> 7,0);
          auVar40._28_4_ = (uint)bVar4 * auVar38._28_4_ | (uint)!bVar4 * auVar37._28_4_;
          auVar37 = vpermt2q_avx512vl(auVar35,auVar40,auVar36);
          uVar28 = auVar37._0_8_;
          bVar20 = bVar20 - 1 & bVar20;
          if (bVar20 != 0) {
            auVar37 = vpshufd_avx2(auVar40,0x55);
            vpermt2q_avx512vl(auVar35,auVar37,auVar36);
            auVar38 = vpminsd_avx2(auVar40,auVar37);
            auVar37 = vpmaxsd_avx2(auVar40,auVar37);
            bVar20 = bVar20 - 1 & bVar20;
            if (bVar20 == 0) {
              auVar38 = vpermi2q_avx512vl(auVar38,auVar35,auVar36);
              uVar28 = auVar38._0_8_;
              auVar35 = vpermt2q_avx512vl(auVar35,auVar37,auVar36);
              *local_26f8 = auVar35._0_8_;
              auVar34 = vpermd_avx2(auVar37,auVar34);
              *(int *)(local_26f8 + 1) = auVar34._0_4_;
              local_26f8 = local_26f8 + 2;
            }
            else {
              auVar42 = vpshufd_avx2(auVar40,0xaa);
              vpermt2q_avx512vl(auVar35,auVar42,auVar36);
              auVar41 = vpminsd_avx2(auVar38,auVar42);
              auVar38 = vpmaxsd_avx2(auVar38,auVar42);
              auVar42 = vpminsd_avx2(auVar37,auVar38);
              auVar37 = vpmaxsd_avx2(auVar37,auVar38);
              bVar20 = bVar20 - 1 & bVar20;
              if (bVar20 == 0) {
                auVar38 = vpermi2q_avx512vl(auVar41,auVar35,auVar36);
                uVar28 = auVar38._0_8_;
                auVar38 = vpermt2q_avx512vl(auVar35,auVar37,auVar36);
                *local_26f8 = auVar38._0_8_;
                auVar37 = vpermd_avx2(auVar37,auVar34);
                *(int *)(local_26f8 + 1) = auVar37._0_4_;
                auVar35 = vpermt2q_avx512vl(auVar35,auVar42,auVar36);
                local_26f8[2] = auVar35._0_8_;
                auVar34 = vpermd_avx2(auVar42,auVar34);
                *(int *)(local_26f8 + 3) = auVar34._0_4_;
                local_26f8 = local_26f8 + 4;
              }
              else {
                auVar38 = vpshufd_avx2(auVar40,0xff);
                vpermt2q_avx512vl(auVar35,auVar38,auVar36);
                auVar43 = vpminsd_avx2(auVar41,auVar38);
                auVar38 = vpmaxsd_avx2(auVar41,auVar38);
                auVar41 = vpminsd_avx2(auVar42,auVar38);
                auVar38 = vpmaxsd_avx2(auVar42,auVar38);
                auVar42 = vpminsd_avx2(auVar37,auVar38);
                auVar37 = vpmaxsd_avx2(auVar37,auVar38);
                bVar20 = bVar20 - 1 & bVar20;
                if (bVar20 == 0) {
                  auVar38 = vpermi2q_avx512vl(auVar43,auVar35,auVar36);
                  uVar28 = auVar38._0_8_;
                  auVar38 = vpermt2q_avx512vl(auVar35,auVar37,auVar36);
                  *local_26f8 = auVar38._0_8_;
                  auVar37 = vpermd_avx2(auVar37,auVar34);
                  *(int *)(local_26f8 + 1) = auVar37._0_4_;
                  auVar37 = vpermt2q_avx512vl(auVar35,auVar42,auVar36);
                  local_26f8[2] = auVar37._0_8_;
                  auVar37 = vpermd_avx2(auVar42,auVar34);
                  *(int *)(local_26f8 + 3) = auVar37._0_4_;
                  auVar35 = vpermt2q_avx512vl(auVar35,auVar41,auVar36);
                  local_26f8[4] = auVar35._0_8_;
                  auVar34 = vpermd_avx2(auVar41,auVar34);
                  *(int *)(local_26f8 + 5) = auVar34._0_4_;
                  local_26f8 = local_26f8 + 6;
                }
                else {
                  auVar39 = valignd_avx512vl(auVar40,auVar40,3);
                  auVar38 = vmovdqa64_avx512vl(auVar88._0_32_);
                  auVar40 = vpermt2d_avx512vl(auVar38,auVar89._0_32_,auVar43);
                  auVar38 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                  auVar41 = vpermt2d_avx512vl(auVar40,auVar38,auVar41);
                  auVar41 = vpermt2d_avx512vl(auVar41,auVar38,auVar42);
                  auVar38 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                  auVar37 = vpermt2d_avx512vl(auVar41,auVar38,auVar37);
                  auVar62 = ZEXT3264(auVar37);
                  bVar23 = bVar20;
                  do {
                    auVar38 = auVar62._0_32_;
                    auVar37 = vpermps_avx512vl(auVar81._0_32_,auVar39);
                    auVar39 = valignd_avx512vl(auVar39,auVar39,1);
                    vpermt2q_avx512vl(auVar35,auVar39,auVar36);
                    bVar23 = bVar23 - 1 & bVar23;
                    uVar12 = vpcmpd_avx512vl(auVar37,auVar38,5);
                    auVar37 = vpmaxsd_avx2(auVar37,auVar38);
                    bVar13 = (byte)uVar12 << 1;
                    auVar38 = valignd_avx512vl(auVar38,auVar38,7);
                    bVar4 = (bool)((byte)uVar12 & 1);
                    auVar42._4_4_ = (uint)bVar4 * auVar38._4_4_ | (uint)!bVar4 * auVar37._4_4_;
                    auVar42._0_4_ = auVar37._0_4_;
                    bVar4 = (bool)(bVar13 >> 2 & 1);
                    auVar42._8_4_ = (uint)bVar4 * auVar38._8_4_ | (uint)!bVar4 * auVar37._8_4_;
                    bVar4 = (bool)(bVar13 >> 3 & 1);
                    auVar42._12_4_ = (uint)bVar4 * auVar38._12_4_ | (uint)!bVar4 * auVar37._12_4_;
                    bVar4 = (bool)(bVar13 >> 4 & 1);
                    auVar42._16_4_ = (uint)bVar4 * auVar38._16_4_ | (uint)!bVar4 * auVar37._16_4_;
                    bVar4 = (bool)(bVar13 >> 5 & 1);
                    auVar42._20_4_ = (uint)bVar4 * auVar38._20_4_ | (uint)!bVar4 * auVar37._20_4_;
                    bVar4 = (bool)(bVar13 >> 6 & 1);
                    auVar42._24_4_ = (uint)bVar4 * auVar38._24_4_ | (uint)!bVar4 * auVar37._24_4_;
                    auVar42._28_4_ =
                         (uint)(bVar13 >> 7) * auVar38._28_4_ |
                         (uint)!(bool)(bVar13 >> 7) * auVar37._28_4_;
                    auVar62 = ZEXT3264(auVar42);
                  } while (bVar23 != 0);
                  lVar21 = (ulong)(uint)POPCOUNT((uint)bVar20) + 3;
                  do {
                    auVar37 = vpermi2q_avx512vl(auVar42,auVar35,auVar36);
                    *local_26f8 = auVar37._0_8_;
                    auVar38 = auVar62._0_32_;
                    auVar37 = vpermd_avx2(auVar38,auVar34);
                    *(int *)(local_26f8 + 1) = auVar37._0_4_;
                    auVar42 = valignd_avx512vl(auVar38,auVar38,1);
                    local_26f8 = local_26f8 + 2;
                    auVar62 = ZEXT3264(auVar42);
                    lVar21 = lVar21 + -1;
                  } while (lVar21 != 0);
                  auVar34 = vpermt2q_avx512vl(auVar35,auVar42,auVar36);
                  uVar28 = auVar34._0_8_;
                }
              }
            }
          }
        }
        local_26d8 = (ulong)((uint)uVar28 & 0xf) - 8;
        if (local_26d8 != 0) {
          uVar28 = uVar28 & 0xfffffffffffffff0;
          local_26e0 = 0;
          do {
            lVar22 = local_26e0 * 0xe0;
            lVar21 = uVar28 + 0xd0 + lVar22;
            local_2540 = *(undefined8 *)(lVar21 + 0x10);
            uStack_2538 = *(undefined8 *)(lVar21 + 0x18);
            lVar21 = uVar28 + 0xc0 + lVar22;
            local_23c0 = *(undefined8 *)(lVar21 + 0x10);
            uStack_23b8 = *(undefined8 *)(lVar21 + 0x18);
            uStack_23b0 = local_23c0;
            uStack_23a8 = uStack_23b8;
            uStack_2530 = local_2540;
            uStack_2528 = uStack_2538;
            auVar57._16_16_ = *(undefined1 (*) [16])(uVar28 + 0x60 + lVar22);
            auVar57._0_16_ = *(undefined1 (*) [16])(uVar28 + lVar22);
            auVar64._16_16_ = *(undefined1 (*) [16])(uVar28 + 0x70 + lVar22);
            auVar64._0_16_ = *(undefined1 (*) [16])(uVar28 + 0x10 + lVar22);
            auVar67._16_16_ = *(undefined1 (*) [16])(uVar28 + 0x80 + lVar22);
            auVar67._0_16_ = *(undefined1 (*) [16])(uVar28 + 0x20 + lVar22);
            auVar33 = *(undefined1 (*) [16])(uVar28 + 0x30 + lVar22);
            auVar34._16_16_ = auVar33;
            auVar34._0_16_ = auVar33;
            auVar5 = *(undefined1 (*) [16])(uVar28 + 0x40 + lVar22);
            auVar35._16_16_ = auVar5;
            auVar35._0_16_ = auVar5;
            auVar30 = *(undefined1 (*) [16])(uVar28 + 0x50 + lVar22);
            auVar36._16_16_ = auVar30;
            auVar36._0_16_ = auVar30;
            auVar32 = *(undefined1 (*) [16])(uVar28 + 0x90 + lVar22);
            auVar61._16_16_ = auVar32;
            auVar61._0_16_ = auVar32;
            auVar32 = *(undefined1 (*) [16])(uVar28 + 0xa0 + lVar22);
            auVar66._16_16_ = auVar32;
            auVar66._0_16_ = auVar32;
            auVar32 = *(undefined1 (*) [16])(uVar28 + 0xb0 + lVar22);
            auVar69._16_16_ = auVar32;
            auVar69._0_16_ = auVar32;
            auVar34 = vsubps_avx(auVar57,auVar34);
            auVar35 = vsubps_avx(auVar64,auVar35);
            auVar36 = vsubps_avx(auVar67,auVar36);
            auVar37 = vsubps_avx(auVar61,auVar57);
            auVar38 = vsubps_avx(auVar66,auVar64);
            auVar41 = vsubps_avx(auVar69,auVar67);
            auVar46._4_4_ = auVar35._4_4_ * auVar41._4_4_;
            auVar46._0_4_ = auVar35._0_4_ * auVar41._0_4_;
            auVar46._8_4_ = auVar35._8_4_ * auVar41._8_4_;
            auVar46._12_4_ = auVar35._12_4_ * auVar41._12_4_;
            auVar46._16_4_ = auVar35._16_4_ * auVar41._16_4_;
            auVar46._20_4_ = auVar35._20_4_ * auVar41._20_4_;
            auVar46._24_4_ = auVar35._24_4_ * auVar41._24_4_;
            auVar46._28_4_ = auVar33._12_4_;
            auVar32 = vfmsub231ps_fma(auVar46,auVar38,auVar36);
            auVar47._4_4_ = auVar36._4_4_ * auVar37._4_4_;
            auVar47._0_4_ = auVar36._0_4_ * auVar37._0_4_;
            auVar47._8_4_ = auVar36._8_4_ * auVar37._8_4_;
            auVar47._12_4_ = auVar36._12_4_ * auVar37._12_4_;
            auVar47._16_4_ = auVar36._16_4_ * auVar37._16_4_;
            auVar47._20_4_ = auVar36._20_4_ * auVar37._20_4_;
            auVar47._24_4_ = auVar36._24_4_ * auVar37._24_4_;
            auVar47._28_4_ = auVar5._12_4_;
            auVar5 = vfmsub231ps_fma(auVar47,auVar41,auVar34);
            auVar48._4_4_ = auVar34._4_4_ * auVar38._4_4_;
            auVar48._0_4_ = auVar34._0_4_ * auVar38._0_4_;
            auVar48._8_4_ = auVar34._8_4_ * auVar38._8_4_;
            auVar48._12_4_ = auVar34._12_4_ * auVar38._12_4_;
            auVar48._16_4_ = auVar34._16_4_ * auVar38._16_4_;
            auVar48._20_4_ = auVar34._20_4_ * auVar38._20_4_;
            auVar48._24_4_ = auVar34._24_4_ * auVar38._24_4_;
            auVar48._28_4_ = auVar30._12_4_;
            uVar55 = *(undefined4 *)&(local_26e8->super_RayK<1>).dir.field_0;
            auVar77._4_4_ = uVar55;
            auVar77._0_4_ = uVar55;
            auVar77._8_4_ = uVar55;
            auVar77._12_4_ = uVar55;
            auVar77._16_4_ = uVar55;
            auVar77._20_4_ = uVar55;
            auVar77._24_4_ = uVar55;
            auVar77._28_4_ = uVar55;
            auVar40 = vbroadcastss_avx512vl
                                (ZEXT416((uint)(local_26e8->super_RayK<1>).dir.field_0.m128[1]));
            auVar42 = vbroadcastss_avx512vl
                                (ZEXT416((uint)(local_26e8->super_RayK<1>).dir.field_0.m128[2]));
            uVar55 = *(undefined4 *)&(local_26e8->super_RayK<1>).org.field_0;
            auVar43._4_4_ = uVar55;
            auVar43._0_4_ = uVar55;
            auVar43._8_4_ = uVar55;
            auVar43._12_4_ = uVar55;
            auVar43._16_4_ = uVar55;
            auVar43._20_4_ = uVar55;
            auVar43._24_4_ = uVar55;
            auVar43._28_4_ = uVar55;
            auVar43 = vsubps_avx512vl(auVar57,auVar43);
            auVar30 = vfmsub231ps_fma(auVar48,auVar37,auVar35);
            uVar55 = *(undefined4 *)((long)&(local_26e8->super_RayK<1>).org.field_0 + 4);
            auVar39._4_4_ = uVar55;
            auVar39._0_4_ = uVar55;
            auVar39._8_4_ = uVar55;
            auVar39._12_4_ = uVar55;
            auVar39._16_4_ = uVar55;
            auVar39._20_4_ = uVar55;
            auVar39._24_4_ = uVar55;
            auVar39._28_4_ = uVar55;
            auVar39 = vsubps_avx512vl(auVar64,auVar39);
            uVar55 = *(undefined4 *)((long)&(local_26e8->super_RayK<1>).org.field_0 + 8);
            auVar44._4_4_ = uVar55;
            auVar44._0_4_ = uVar55;
            auVar44._8_4_ = uVar55;
            auVar44._12_4_ = uVar55;
            auVar44._16_4_ = uVar55;
            auVar44._20_4_ = uVar55;
            auVar44._24_4_ = uVar55;
            auVar44._28_4_ = uVar55;
            auVar44 = vsubps_avx512vl(auVar67,auVar44);
            auVar45 = vmulps_avx512vl(auVar40,auVar44);
            auVar46 = vfmsub231ps_avx512vl(auVar45,auVar39,auVar42);
            auVar45 = vmulps_avx512vl(auVar42,auVar43);
            auVar47 = vfmsub231ps_avx512vl(auVar45,auVar44,auVar77);
            auVar45 = vmulps_avx512vl(auVar77,auVar39);
            auVar48 = vfmsub231ps_avx512vl(auVar45,auVar43,auVar40);
            auVar42 = vmulps_avx512vl(ZEXT1632(auVar30),auVar42);
            auVar40 = vfmadd231ps_avx512vl(auVar42,ZEXT1632(auVar5),auVar40);
            local_24c0 = vfmadd231ps_avx512vl(auVar40,ZEXT1632(auVar32),auVar77);
            auVar45._8_4_ = 0x7fffffff;
            auVar45._0_8_ = 0x7fffffff7fffffff;
            auVar45._12_4_ = 0x7fffffff;
            auVar45._16_4_ = 0x7fffffff;
            auVar45._20_4_ = 0x7fffffff;
            auVar45._24_4_ = 0x7fffffff;
            auVar45._28_4_ = 0x7fffffff;
            vandps_avx512vl(local_24c0,auVar45);
            auVar41 = vmulps_avx512vl(auVar41,auVar48);
            auVar38 = vfmadd231ps_avx512vl(auVar41,auVar47,auVar38);
            auVar33 = vfmadd231ps_fma(auVar38,auVar46,auVar37);
            auVar14._8_4_ = 0x80000000;
            auVar14._0_8_ = 0x8000000080000000;
            auVar14._12_4_ = 0x80000000;
            auVar14._16_4_ = 0x80000000;
            auVar14._20_4_ = 0x80000000;
            auVar14._24_4_ = 0x80000000;
            auVar14._28_4_ = 0x80000000;
            auVar37 = vandpd_avx512vl(local_24c0,auVar14);
            uVar70 = auVar37._0_4_;
            auVar65._0_4_ = (float)(uVar70 ^ auVar33._0_4_);
            uVar71 = auVar37._4_4_;
            auVar65._4_4_ = (float)(uVar71 ^ auVar33._4_4_);
            uVar24 = auVar37._8_4_;
            auVar65._8_4_ = (float)(uVar24 ^ auVar33._8_4_);
            uVar72 = auVar37._12_4_;
            auVar65._12_4_ = (float)(uVar72 ^ auVar33._12_4_);
            fVar51 = auVar37._16_4_;
            auVar65._16_4_ = fVar51;
            fVar73 = auVar37._20_4_;
            auVar65._20_4_ = fVar73;
            fVar74 = auVar37._24_4_;
            auVar65._24_4_ = fVar74;
            fVar75 = auVar37._28_4_;
            auVar65._28_4_ = fVar75;
            auVar36 = vmulps_avx512vl(auVar36,auVar48);
            auVar35 = vfmadd231ps_avx512vl(auVar36,auVar35,auVar47);
            auVar33 = vfmadd231ps_fma(auVar35,auVar34,auVar46);
            auVar68._0_4_ = (float)(uVar70 ^ auVar33._0_4_);
            auVar68._4_4_ = (float)(uVar71 ^ auVar33._4_4_);
            auVar68._8_4_ = (float)(uVar24 ^ auVar33._8_4_);
            auVar68._12_4_ = (float)(uVar72 ^ auVar33._12_4_);
            auVar68._16_4_ = fVar51;
            auVar68._20_4_ = fVar73;
            auVar68._24_4_ = fVar74;
            auVar68._28_4_ = fVar75;
            uVar12 = vcmpps_avx512vl(auVar65,ZEXT832(0) << 0x20,5);
            uVar9 = vcmpps_avx512vl(auVar68,ZEXT832(0) << 0x20,5);
            uVar10 = vcmpps_avx512vl(local_24c0,ZEXT832(0) << 0x20,4);
            auVar76._0_4_ = auVar65._0_4_ + auVar68._0_4_;
            auVar76._4_4_ = auVar65._4_4_ + auVar68._4_4_;
            auVar76._8_4_ = auVar65._8_4_ + auVar68._8_4_;
            auVar76._12_4_ = auVar65._12_4_ + auVar68._12_4_;
            auVar76._16_4_ = fVar51 + fVar51;
            auVar76._20_4_ = fVar73 + fVar73;
            auVar76._24_4_ = fVar74 + fVar74;
            auVar76._28_4_ = fVar75 + fVar75;
            uVar11 = vcmpps_avx512vl(auVar76,local_24c0,2);
            local_249f = (byte)uVar12 & (byte)uVar9 & (byte)uVar10 & (byte)uVar11;
            if (local_249f != 0) {
              auVar19._4_4_ = auVar44._4_4_ * auVar30._4_4_;
              auVar19._0_4_ = auVar44._0_4_ * auVar30._0_4_;
              auVar19._8_4_ = auVar44._8_4_ * auVar30._8_4_;
              auVar19._12_4_ = auVar44._12_4_ * auVar30._12_4_;
              auVar19._16_4_ = auVar44._16_4_ * 0.0;
              auVar19._20_4_ = auVar44._20_4_ * 0.0;
              auVar19._24_4_ = auVar44._24_4_ * 0.0;
              auVar19._28_4_ = auVar44._28_4_;
              auVar33 = vfmadd213ps_fma(auVar39,ZEXT1632(auVar5),auVar19);
              auVar33 = vfmadd213ps_fma(auVar43,ZEXT1632(auVar32),ZEXT1632(auVar33));
              local_24e0._0_4_ = (float)(uVar70 ^ auVar33._0_4_);
              local_24e0._4_4_ = (float)(uVar71 ^ auVar33._4_4_);
              local_24e0._8_4_ = (float)(uVar24 ^ auVar33._8_4_);
              local_24e0._12_4_ = (float)(uVar72 ^ auVar33._12_4_);
              local_24e0._16_4_ = fVar51;
              local_24e0._20_4_ = fVar73;
              local_24e0._24_4_ = fVar74;
              local_24e0._28_4_ = fVar75;
              uVar55 = *(undefined4 *)((long)&(local_26e8->super_RayK<1>).org.field_0 + 0xc);
              auVar15._4_4_ = uVar55;
              auVar15._0_4_ = uVar55;
              auVar15._8_4_ = uVar55;
              auVar15._12_4_ = uVar55;
              auVar15._16_4_ = uVar55;
              auVar15._20_4_ = uVar55;
              auVar15._24_4_ = uVar55;
              auVar15._28_4_ = uVar55;
              auVar34 = vmulps_avx512vl(local_24c0,auVar15);
              uVar12 = vcmpps_avx512vl(auVar34,local_24e0,1);
              fVar56 = (local_26e8->super_RayK<1>).tfar;
              auVar16._4_4_ = fVar56;
              auVar16._0_4_ = fVar56;
              auVar16._8_4_ = fVar56;
              auVar16._12_4_ = fVar56;
              auVar16._16_4_ = fVar56;
              auVar16._20_4_ = fVar56;
              auVar16._24_4_ = fVar56;
              auVar16._28_4_ = fVar56;
              auVar34 = vmulps_avx512vl(local_24c0,auVar16);
              uVar9 = vcmpps_avx512vl(local_24e0,auVar34,2);
              local_249f = (byte)uVar12 & (byte)uVar9 & local_249f;
              if (local_249f != 0) {
                auVar34 = *(undefined1 (*) [32])&(local_26e8->super_RayK<1>).tfar;
                auVar62 = ZEXT3264(auVar34);
                uVar70 = vextractps_avx(auVar34._0_16_,1);
                auVar34 = vsubps_avx(local_24c0,auVar68);
                local_2520 = vblendps_avx(auVar65,auVar34,0xf0);
                auVar34 = vsubps_avx(local_24c0,auVar65);
                local_2500 = vblendps_avx(auVar68,auVar34,0xf0);
                fVar56 = (float)DAT_01fef940;
                local_2420._0_4_ = auVar32._0_4_ * fVar56;
                fVar58 = DAT_01fef940._4_4_;
                local_2420._4_4_ = auVar32._4_4_ * fVar58;
                fVar59 = DAT_01fef940._8_4_;
                local_2420._8_4_ = auVar32._8_4_ * fVar59;
                fVar60 = DAT_01fef940._12_4_;
                local_2420._12_4_ = auVar32._12_4_ * fVar60;
                fVar6 = DAT_01fef940._16_4_;
                local_2420._16_4_ = fVar6 * 0.0;
                fVar7 = DAT_01fef940._20_4_;
                local_2420._20_4_ = fVar7 * 0.0;
                fVar8 = DAT_01fef940._24_4_;
                local_2420._24_4_ = fVar8 * 0.0;
                local_2420._28_4_ = 0;
                local_2400._4_4_ = auVar5._4_4_ * fVar58;
                local_2400._0_4_ = auVar5._0_4_ * fVar56;
                local_2400._8_4_ = auVar5._8_4_ * fVar59;
                local_2400._12_4_ = auVar5._12_4_ * fVar60;
                local_2400._16_4_ = fVar6 * 0.0;
                local_2400._20_4_ = fVar7 * 0.0;
                local_2400._24_4_ = fVar8 * 0.0;
                local_2400._28_4_ = 0;
                local_23e0._4_4_ = auVar30._4_4_ * fVar58;
                local_23e0._0_4_ = auVar30._0_4_ * fVar56;
                local_23e0._8_4_ = auVar30._8_4_ * fVar59;
                local_23e0._12_4_ = auVar30._12_4_ * fVar60;
                local_23e0._16_4_ = fVar6 * 0.0;
                local_23e0._20_4_ = fVar7 * 0.0;
                local_23e0._24_4_ = fVar8 * 0.0;
                local_23e0._28_4_ = 0;
                auVar34 = vrcp14ps_avx512vl(local_24c0);
                auVar17._8_4_ = 0x3f800000;
                auVar17._0_8_ = 0x3f8000003f800000;
                auVar17._12_4_ = 0x3f800000;
                auVar17._16_4_ = 0x3f800000;
                auVar17._20_4_ = 0x3f800000;
                auVar17._24_4_ = 0x3f800000;
                auVar17._28_4_ = 0x3f800000;
                auVar35 = vfnmadd213ps_avx512vl(local_24c0,auVar34,auVar17);
                auVar33 = vfmadd132ps_fma(auVar35,auVar34,auVar34);
                fVar56 = auVar33._0_4_;
                fVar58 = auVar33._4_4_;
                local_2440._4_4_ = fVar58 * local_24e0._4_4_;
                local_2440._0_4_ = fVar56 * local_24e0._0_4_;
                fVar59 = auVar33._8_4_;
                local_2440._8_4_ = fVar59 * local_24e0._8_4_;
                fVar60 = auVar33._12_4_;
                local_2440._12_4_ = fVar60 * local_24e0._12_4_;
                local_2440._16_4_ = fVar51 * 0.0;
                local_2440._20_4_ = fVar73 * 0.0;
                local_2440._24_4_ = fVar74 * 0.0;
                local_2440._28_4_ = fVar75;
                auVar54 = ZEXT3264(local_2440);
                local_2480[0] = local_2520._0_4_ * fVar56;
                local_2480[1] = local_2520._4_4_ * fVar58;
                local_2480[2] = local_2520._8_4_ * fVar59;
                local_2480[3] = local_2520._12_4_ * fVar60;
                fStack_2470 = local_2520._16_4_ * 0.0;
                fStack_246c = local_2520._20_4_ * 0.0;
                fStack_2468 = local_2520._24_4_ * 0.0;
                uStack_2464 = auVar34._28_4_;
                local_2460[0] = local_2500._0_4_ * fVar56;
                local_2460[1] = local_2500._4_4_ * fVar58;
                local_2460[2] = local_2500._8_4_ * fVar59;
                local_2460[3] = local_2500._12_4_ * fVar60;
                fStack_2450 = local_2500._16_4_ * 0.0;
                fStack_244c = local_2500._20_4_ * 0.0;
                fStack_2448 = local_2500._24_4_ * 0.0;
                uStack_2444 = auVar34._28_4_;
                auVar52._8_4_ = 0x7f800000;
                auVar52._0_8_ = 0x7f8000007f800000;
                auVar52._12_4_ = 0x7f800000;
                auVar52._16_4_ = 0x7f800000;
                auVar52._20_4_ = 0x7f800000;
                auVar52._24_4_ = 0x7f800000;
                auVar52._28_4_ = 0x7f800000;
                auVar34 = vblendmps_avx512vl(auVar52,local_2440);
                auVar49._0_4_ =
                     (uint)(local_249f & 1) * auVar34._0_4_ |
                     (uint)!(bool)(local_249f & 1) * 0x7f800000;
                bVar4 = (bool)(local_249f >> 1 & 1);
                auVar49._4_4_ = (uint)bVar4 * auVar34._4_4_ | (uint)!bVar4 * 0x7f800000;
                bVar4 = (bool)(local_249f >> 2 & 1);
                auVar49._8_4_ = (uint)bVar4 * auVar34._8_4_ | (uint)!bVar4 * 0x7f800000;
                bVar4 = (bool)(local_249f >> 3 & 1);
                auVar49._12_4_ = (uint)bVar4 * auVar34._12_4_ | (uint)!bVar4 * 0x7f800000;
                bVar4 = (bool)(local_249f >> 4 & 1);
                auVar49._16_4_ = (uint)bVar4 * auVar34._16_4_ | (uint)!bVar4 * 0x7f800000;
                bVar4 = (bool)(local_249f >> 5 & 1);
                auVar49._20_4_ = (uint)bVar4 * auVar34._20_4_ | (uint)!bVar4 * 0x7f800000;
                bVar4 = (bool)(local_249f >> 6 & 1);
                auVar49._24_4_ = (uint)bVar4 * auVar34._24_4_ | (uint)!bVar4 * 0x7f800000;
                auVar49._28_4_ =
                     (uint)(local_249f >> 7) * auVar34._28_4_ |
                     (uint)!(bool)(local_249f >> 7) * 0x7f800000;
                auVar34 = vshufps_avx(auVar49,auVar49,0xb1);
                auVar34 = vminps_avx(auVar49,auVar34);
                auVar35 = vshufpd_avx(auVar34,auVar34,5);
                auVar34 = vminps_avx(auVar34,auVar35);
                auVar35 = vpermpd_avx2(auVar34,0x4e);
                auVar34 = vminps_avx(auVar34,auVar35);
                uVar12 = vcmpps_avx512vl(auVar49,auVar34,0);
                local_2724 = (uint)local_249f;
                bVar20 = local_249f;
                if ((local_249f & (byte)uVar12) != 0) {
                  bVar20 = local_249f & (byte)uVar12;
                }
                uVar71 = 0;
                for (uVar24 = (uint)bVar20; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x80000000) {
                  uVar71 = uVar71 + 1;
                }
                local_26c8 = local_26f0->scene;
                do {
                  uVar24 = uVar71 & 0xff;
                  local_2678 = *(uint *)((long)&local_23c0 + (ulong)uVar24 * 4);
                  local_26d0 = (local_26c8->geometries).items[local_2678].ptr;
                  if ((local_26d0->mask & uVar70) == 0) {
                    local_2724 = (uint)(~(byte)(1 << (uVar71 & 0x1f)) & (byte)local_2724);
                  }
                  else {
                    pRVar3 = local_26f0->args;
                    local_2660 = auVar62._0_32_;
                    local_2640 = auVar54._0_32_;
                    local_2620 = auVar85._0_32_;
                    local_2600 = auVar84._0_32_;
                    local_25e0 = auVar83._0_32_;
                    local_25c0 = auVar82._0_32_;
                    local_25a0 = auVar80._0_32_;
                    local_2580 = auVar79._0_32_;
                    local_2560 = auVar78._0_32_;
                    if (pRVar3->filter == (RTCFilterFunctionN)0x0) {
                      local_26c0.context = local_26f0->user;
                      if (local_26d0->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        uVar25 = (ulong)(uVar24 << 2);
                        fVar51 = *(float *)((long)local_2480 + uVar25);
                        fVar73 = *(float *)((long)local_2460 + uVar25);
                        (local_26e8->super_RayK<1>).tfar = *(float *)(local_2440 + uVar25);
                        (local_26e8->Ng).field_0.field_0.x = *(float *)(local_2420 + uVar25);
                        (local_26e8->Ng).field_0.field_0.y = *(float *)(local_2400 + uVar25);
                        (local_26e8->Ng).field_0.field_0.z = *(float *)(local_23e0 + uVar25);
                        local_26e8->u = fVar51;
                        local_26e8->v = fVar73;
                        local_26e8->primID = *(uint *)((long)&local_2540 + uVar25);
                        local_26e8->geomID = local_2678;
                        local_26e8->instID[0] = (local_26c0.context)->instID[0];
                        local_26e8->instPrimID[0] = (local_26c0.context)->instPrimID[0];
                        break;
                      }
                    }
                    else {
                      local_26c0.context = local_26f0->user;
                    }
                    uVar25 = (ulong)(uVar24 * 4);
                    local_2690 = *(float *)(local_2420 + uVar25);
                    local_268c = *(undefined4 *)(local_2400 + uVar25);
                    local_2688 = *(undefined4 *)(local_23e0 + uVar25);
                    local_2684 = *(undefined4 *)((long)local_2480 + uVar25);
                    local_2680 = *(undefined4 *)((long)local_2460 + uVar25);
                    local_267c = *(undefined4 *)((long)&local_2540 + uVar25);
                    local_2674 = (local_26c0.context)->instID[0];
                    local_2670 = (local_26c0.context)->instPrimID[0];
                    (local_26e8->super_RayK<1>).tfar = *(float *)(local_2440 + uVar25);
                    local_270c = -1;
                    local_26c0.valid = &local_270c;
                    local_26c0.geometryUserPtr = local_26d0->userPtr;
                    local_26c0.ray = (RTCRayN *)local_26e8;
                    local_26c0.hit = (RTCHitN *)&local_2690;
                    local_26c0.N = 1;
                    if (((local_26d0->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                        ((*local_26d0->intersectionFilterN)(&local_26c0), *local_26c0.valid != 0))
                       && ((pRVar3->filter == (RTCFilterFunctionN)0x0 ||
                           ((((pRVar3->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                              RTC_RAY_QUERY_FLAG_INCOHERENT &&
                             (((local_26d0->field_8).field_0x2 & 0x40) == 0)) ||
                            ((*pRVar3->filter)(&local_26c0), *local_26c0.valid != 0)))))) {
                      (((Vec3f *)((long)local_26c0.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_26c0.hit;
                      (((Vec3f *)((long)local_26c0.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_26c0.hit + 4);
                      (((Vec3f *)((long)local_26c0.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_26c0.hit + 8);
                      *(float *)((long)local_26c0.ray + 0x3c) = *(float *)(local_26c0.hit + 0xc);
                      *(float *)((long)local_26c0.ray + 0x40) = *(float *)(local_26c0.hit + 0x10);
                      *(float *)((long)local_26c0.ray + 0x44) = *(float *)(local_26c0.hit + 0x14);
                      *(float *)((long)local_26c0.ray + 0x48) = *(float *)(local_26c0.hit + 0x18);
                      *(float *)((long)local_26c0.ray + 0x4c) = *(float *)(local_26c0.hit + 0x1c);
                      *(float *)((long)local_26c0.ray + 0x50) = *(float *)(local_26c0.hit + 0x20);
                    }
                    else {
                      (local_26e8->super_RayK<1>).tfar = (float)local_2660._0_4_;
                    }
                    auVar54 = ZEXT3264(local_2640);
                    fVar51 = (local_26e8->super_RayK<1>).tfar;
                    auVar18._4_4_ = fVar51;
                    auVar18._0_4_ = fVar51;
                    auVar18._8_4_ = fVar51;
                    auVar18._12_4_ = fVar51;
                    auVar18._16_4_ = fVar51;
                    auVar18._20_4_ = fVar51;
                    auVar18._24_4_ = fVar51;
                    auVar18._28_4_ = fVar51;
                    uVar12 = vcmpps_avx512vl(local_2640,auVar18,2);
                    local_2724 = (uint)(~(byte)(1 << (uVar71 & 0x1f)) & (byte)local_2724) &
                                 (uint)uVar12;
                    uVar70 = (local_26e8->super_RayK<1>).mask;
                    auVar62 = ZEXT464((uint)(local_26e8->super_RayK<1>).tfar);
                    auVar78 = ZEXT3264(local_2560);
                    auVar79 = ZEXT3264(local_2580);
                    auVar80 = ZEXT3264(local_25a0);
                    auVar34 = vbroadcastss_avx512vl(ZEXT416(1));
                    auVar81 = ZEXT3264(auVar34);
                    auVar82 = ZEXT3264(local_25c0);
                    auVar83 = ZEXT3264(local_25e0);
                    auVar84 = ZEXT3264(local_2600);
                    auVar85 = ZEXT3264(local_2620);
                    auVar34 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
                    auVar86 = ZEXT3264(auVar34);
                    auVar34 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
                    auVar87 = ZEXT3264(auVar34);
                    auVar33 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
                    auVar88 = ZEXT1664(auVar33);
                    auVar34 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                    auVar89 = ZEXT3264(auVar34);
                  }
                  bVar20 = (byte)local_2724;
                  if (bVar20 == 0) break;
                  auVar53._8_4_ = 0x7f800000;
                  auVar53._0_8_ = 0x7f8000007f800000;
                  auVar53._12_4_ = 0x7f800000;
                  auVar53._16_4_ = 0x7f800000;
                  auVar53._20_4_ = 0x7f800000;
                  auVar53._24_4_ = 0x7f800000;
                  auVar53._28_4_ = 0x7f800000;
                  auVar34 = vblendmps_avx512vl(auVar53,auVar54._0_32_);
                  auVar50._0_4_ =
                       (uint)(bVar20 & 1) * auVar34._0_4_ | (uint)!(bool)(bVar20 & 1) * 0x7f800000;
                  bVar4 = (bool)((byte)(local_2724 >> 1) & 1);
                  auVar50._4_4_ = (uint)bVar4 * auVar34._4_4_ | (uint)!bVar4 * 0x7f800000;
                  bVar4 = (bool)((byte)(local_2724 >> 2) & 1);
                  auVar50._8_4_ = (uint)bVar4 * auVar34._8_4_ | (uint)!bVar4 * 0x7f800000;
                  bVar4 = (bool)((byte)(local_2724 >> 3) & 1);
                  auVar50._12_4_ = (uint)bVar4 * auVar34._12_4_ | (uint)!bVar4 * 0x7f800000;
                  bVar4 = (bool)((byte)(local_2724 >> 4) & 1);
                  auVar50._16_4_ = (uint)bVar4 * auVar34._16_4_ | (uint)!bVar4 * 0x7f800000;
                  bVar4 = (bool)((byte)(local_2724 >> 5) & 1);
                  auVar50._20_4_ = (uint)bVar4 * auVar34._20_4_ | (uint)!bVar4 * 0x7f800000;
                  bVar4 = (bool)((byte)(local_2724 >> 6) & 1);
                  auVar50._24_4_ = (uint)bVar4 * auVar34._24_4_ | (uint)!bVar4 * 0x7f800000;
                  auVar50._28_4_ =
                       (local_2724 >> 7) * auVar34._28_4_ |
                       (uint)!SUB41(local_2724 >> 7,0) * 0x7f800000;
                  auVar34 = vshufps_avx(auVar50,auVar50,0xb1);
                  auVar34 = vminps_avx(auVar50,auVar34);
                  auVar35 = vshufpd_avx(auVar34,auVar34,5);
                  auVar34 = vminps_avx(auVar34,auVar35);
                  auVar35 = vpermpd_avx2(auVar34,0x4e);
                  auVar34 = vminps_avx(auVar34,auVar35);
                  uVar12 = vcmpps_avx512vl(auVar50,auVar34,0);
                  bVar20 = (byte)uVar12 & bVar20;
                  uVar24 = local_2724;
                  if (bVar20 != 0) {
                    uVar24 = (uint)bVar20;
                  }
                  uVar71 = 0;
                  for (; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x80000000) {
                    uVar71 = uVar71 + 1;
                  }
                } while( true );
              }
            }
            local_26e0 = local_26e0 + 1;
          } while (local_26e0 != local_26d8);
        }
        fVar51 = (local_26e8->super_RayK<1>).tfar;
        auVar54 = ZEXT3264(CONCAT428(fVar51,CONCAT424(fVar51,CONCAT420(fVar51,CONCAT416(fVar51,
                                                  CONCAT412(fVar51,CONCAT48(fVar51,CONCAT44(fVar51,
                                                  fVar51))))))));
      }
LAB_01f23fea:
    } while (local_26f8 != &local_23a0);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }